

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O0

basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
kainjow::mustache::basic_mustache<std::__cxx11::string>::render<std::__cxx11::ostringstream>
          (basic_mustache<std::__cxx11::string> *this,
          basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *data,basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *stream)

{
  anon_class_8_1_6bf940be local_48;
  render_handler local_40;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *stream_local;
  basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *data_local;
  basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_48.stream = stream;
  local_20 = stream;
  stream_local = (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)data;
  data_local = (basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this;
  std::function<void(std::__cxx11::string_const&)>::
  function<kainjow::mustache::basic_mustache<std::__cxx11::string>::render<std::__cxx11::ostringstream>(kainjow::mustache::basic_data<std::__cxx11::string>const&,std::__cxx11::ostringstream&)::_lambda(std::__cxx11::string_const&)_1_,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_40,&local_48);
  basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  render((basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)this,data,&local_40);
  Catch::clara::std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_40);
  return local_20;
}

Assistant:

stream_type& render(const basic_data<string_type>& data, stream_type& stream) {
        render(data, [&stream](const string_type& str) {
            stream << str;
        });
        return stream;
    }